

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_cpu_support_x86_f16c(void)

{
  int nIds;
  uint cpu_info [4];
  uint *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  int local_18 [2];
  uint local_10;
  uint local_4;
  
  memset(local_18,0,0x10);
  x86_cpuid(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  if (local_18[0] < 1) {
    local_4 = 0;
  }
  else {
    x86_cpuid(local_18[0],in_stack_ffffffffffffffd8);
    local_4 = local_10 & 0x20000000;
  }
  return local_4;
}

Assistant:

static int get_cpu_support_x86_f16c()
{
#if !NCNN_F16C
    return 0;
#endif
    unsigned int cpu_info[4] = {0};
    x86_cpuid(0, cpu_info);

    int nIds = cpu_info[0];
    if (nIds < 1)
        return 0;

    x86_cpuid(1, cpu_info);

    return cpu_info[2] & (1u << 29);
}